

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O2

void __thiscall
duckdb::RegexOptimizationRule::RegexOptimizationRule
          (RegexOptimizationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> _Var3;
  pointer pFVar4;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_30;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> local_28;
  ExpressionMatcher *local_20;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_027a1878;
  make_uniq<duckdb::FunctionExpressionMatcher>();
  make_uniq<duckdb::SpecificFunctionMatcher,char_const(&)[15]>
            ((duckdb *)&local_30,(char (*) [15])"regexp_matches");
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (ExpressionMatcher *)0x0;
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_28);
  _Var1._M_head_impl =
       (pFVar4->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar4->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl =
       (FunctionMatcher *)_Var2._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  if (local_30._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_28);
  pFVar4->policy = SOME_ORDERED;
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_28);
  make_uniq<duckdb::ExpressionMatcher>();
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar4->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_30);
  if (local_30._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_28);
  make_uniq<duckdb::ConstantExpressionMatcher>();
  local_30._M_head_impl = local_20;
  local_20 = (ExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar4->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_30);
  if (local_30._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  local_30._M_head_impl = (ExpressionMatcher *)0x0;
  if (local_20 != (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  _Var3._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (FunctionExpressionMatcher *)0x0;
  _Var2._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var3._M_head_impl)->super_ExpressionMatcher;
  if (_Var2._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_28._M_head_impl != (FunctionExpressionMatcher *)0x0) {
      (*((local_28._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
    }
  }
  return;
}

Assistant:

RegexOptimizationRule::RegexOptimizationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	auto func = make_uniq<FunctionExpressionMatcher>();
	func->function = make_uniq<SpecificFunctionMatcher>("regexp_matches");
	func->policy = SetMatcher::Policy::SOME_ORDERED;
	func->matchers.push_back(make_uniq<ExpressionMatcher>());
	func->matchers.push_back(make_uniq<ConstantExpressionMatcher>());

	root = std::move(func);
}